

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,256ul,16ul>>
::
unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>,256ul,16ul>>
          *this,size_t hash,try_emplace_args_t *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,
          pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool> *args_2)

{
  locator local_68;
  arrays_type new_arrays_;
  
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::new_arrays_for_growth
            (&new_arrays_,
             (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
              *)this);
  __return_storage_ptr__->pg = (group15<boost::unordered::detail::foa::plain_integral> *)0x0;
  __return_storage_ptr__->n = 0;
  __return_storage_ptr__->p =
       (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>
        *)0x0;
  nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,std::pair<slang::syntax::NamedParamAssignmentSyntax_const*,bool>>
            (&local_68,this,&new_arrays_,hash >> ((byte)new_arrays_.groups_size_index & 0x3f),hash,
             args,args_1,args_2);
  __return_storage_ptr__->p = local_68.p;
  __return_storage_ptr__->pg = local_68.pg;
  __return_storage_ptr__->n = local_68.n;
  *(undefined4 *)&__return_storage_ptr__->field_0xc = local_68._12_4_;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::unchecked_rehash((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedParamAssignmentSyntax_*,_bool>_>,_256UL,_16UL>_>
                      *)this,&new_arrays_);
  *(long *)(this + 0x30) = *(long *)(this + 0x30) + 1;
  return __return_storage_ptr__;
}

Assistant:

BOOST_NOINLINE locator unchecked_emplace_with_rehash(std::size_t hash, Args&&... args) {
        auto new_arrays_ = new_arrays_for_growth();
        locator it;
        BOOST_TRY {
            /* strong exception guarantee -> try insertion before rehash */
            it = nosize_unchecked_emplace_at(new_arrays_, position_for(hash, new_arrays_), hash,
                                             std::forward<Args>(args)...);
        }